

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitation_impl.hpp
# Opt level: O0

result_type
boost::detail::variant::
visitation_impl_invoke<boost::detail::variant::invoke_visitor<boost::detail::variant::get_visitor<spartsi::ref_node>>,void*,spartsi::ref_node,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
          (undefined4 internal_which,undefined8 visitor,undefined8 storage,undefined8 t)

{
  result_type pnVar1;
  int param_5_local;
  ref_node *t_local;
  void *storage_local;
  invoke_visitor<boost::detail::variant::get_visitor<spartsi::ref_node>_> *visitor_local;
  int internal_which_local;
  
  pnVar1 = visitation_impl_invoke_impl<boost::detail::variant::invoke_visitor<boost::detail::variant::get_visitor<spartsi::ref_node>>,void*,spartsi::ref_node>
                     (internal_which,visitor,storage,t);
  return pnVar1;
}

Assistant:

visitation_impl_invoke(
      int internal_which, Visitor& visitor, VoidPtrCV storage, T* t
    , NoBackupFlag
    , int
    )
{
    typedef typename mpl::or_<
          NoBackupFlag
        , is_nothrow_move_constructible<T>
        , has_nothrow_copy<T>
        >::type never_uses_backup;

    return (visitation_impl_invoke_impl)(
          internal_which, visitor, storage, t
        , never_uses_backup()
        );
}